

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void pgetrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  byte *pbVar4;
  ulong uVar5;
  uint extraout_EDX;
  int extraout_EDX_00;
  long extraout_RDX;
  ulong unaff_RBX;
  ulong uVar6;
  int *unaff_RBP;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  uchar c;
  byte bStack_d5;
  uint uStack_d4;
  ulong uStack_d0;
  long lStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  byte *pbStack_b0;
  byte *pbStack_a8;
  byte *pbStack_a0;
  code *pcStack_98;
  byte bStack_8d;
  uint uStack_8c;
  byte *pbStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  byte *pbStack_68;
  float *pfStack_60;
  byte *pbStack_58;
  code *pcStack_50;
  byte local_45;
  uint local_44;
  byte *local_40;
  long local_38;
  
  uVar6 = (ulong)(uint)r;
  uVar5 = (ulong)(uint)sy;
  pbVar9 = (byte *)(ulong)(uint)sx;
  uVar13 = (ulong)(uint)r;
  pbVar8 = (byte *)(ulong)(uint)sy;
  pbVar16 = (byte *)0x0;
  pcStack_50 = (code *)0x102da9;
  local_44 = sx;
  uVar1 = open(fn,0);
  pbVar18 = pbVar8;
  if ((int)uVar1 < 1) {
LAB_00102e53:
    pcStack_50 = (code *)0x102e58;
    pgetrast_cold_1();
  }
  else {
    unaff_RBP = (int *)(ulong)uVar1;
    fn = (char *)(ulong)uVar1;
    pcStack_50 = (code *)0x102dc2;
    pbVar16 = hd;
    sVar3 = read(uVar1,hd,0x20);
    if (sVar3 == 0x20) {
      if (0 < sy) {
        unaff_RBX = (ulong)local_44;
        local_38 = (long)r << 2;
        hd = (byte *)0x0;
        pbVar18 = &local_45;
        pbVar9 = pbVar8;
        local_40 = pbVar8;
        do {
          if (0 < (int)local_44) {
            uVar13 = 0;
            do {
              pcStack_50 = (code *)0x102e0a;
              pbVar16 = pbVar18;
              fn = (char *)unaff_RBP;
              sVar3 = read(uVar1,pbVar18,1);
              if (sVar3 != 1) {
                pcStack_50 = (code *)0x102e53;
                pgetrast_cold_3();
                goto LAB_00102e53;
              }
              bf[uVar13] = (float)local_45;
              uVar13 = uVar13 + 1;
            } while (unaff_RBX != uVar13);
          }
          hd = hd + 1;
          bf = (float *)((long)bf + local_38);
        } while (hd != local_40);
      }
      close(uVar1);
      return;
    }
  }
  pcStack_50 = Bpgetrast;
  pgetrast_cold_2();
  uVar14 = uVar5 & 0xffffffff;
  pbVar4 = (byte *)((ulong)pbVar9 & 0xffffffff);
  pbVar8 = (byte *)0x0;
  pcStack_98 = (code *)0x102e81;
  uVar15 = uVar5;
  uVar1 = (uint)pbVar9;
  uStack_8c = extraout_EDX;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar13;
  pbStack_68 = hd;
  pfStack_60 = bf;
  pbStack_58 = pbVar18;
  pcStack_50 = (code *)unaff_RBP;
  uVar2 = open(fn,0);
  uVar12 = (uint)uVar15;
  iVar11 = (int)uVar6;
  pbVar18 = pbVar4;
  if (0 < (int)uVar2) {
    unaff_RBP = (int *)(ulong)uVar2;
    if (0 < (int)(uint)pbVar9) {
      unaff_RBX = (ulong)uStack_8c;
      lStack_80 = (long)(int)uVar5 << 2;
      hd = (byte *)0x0;
      pbVar18 = &bStack_8d;
      pbStack_88 = pbVar4;
      do {
        if (0 < (int)uStack_8c) {
          uVar14 = 0;
          do {
            pcStack_98 = (code *)0x102ec9;
            pbVar8 = pbVar18;
            fn = (char *)unaff_RBP;
            sVar3 = read(uVar2,pbVar18,1);
            uVar1 = (uint)pbVar4;
            uVar12 = (uint)uVar15;
            iVar11 = (int)uVar6;
            if (sVar3 != 1) {
              pcStack_98 = (code *)0x102f12;
              Bpgetrast_cold_2();
              goto LAB_00102f12;
            }
            *(float *)(pbVar16 + uVar14 * 4) = (float)bStack_8d;
            uVar14 = uVar14 + 1;
          } while (unaff_RBX != uVar14);
        }
        hd = hd + 1;
        pbVar16 = pbVar16 + lStack_80;
      } while (hd != pbStack_88);
    }
    close(uVar2);
    return;
  }
LAB_00102f12:
  pcStack_98 = pputrast;
  Bpgetrast_cold_1();
  uVar5 = (ulong)uVar12;
  pbVar9 = (byte *)0x180;
  uStack_d4 = uVar1;
  uStack_c0 = unaff_RBX;
  uStack_b8 = uVar14;
  pbStack_b0 = hd;
  pbStack_a8 = pbVar16;
  pbStack_a0 = pbVar18;
  pcStack_98 = (code *)unaff_RBP;
  uVar2 = creat(fn,0x180);
  if ((int)uVar2 < 1) {
LAB_00102fe1:
    pputrast_cold_1();
  }
  else {
    fn = (char *)(ulong)uVar2;
    sVar3 = write(uVar2,pbVar8,0x20);
    pbVar9 = pbVar8;
    if (sVar3 == 0x20) {
      if (0 < (int)uVar12) {
        uVar6 = (ulong)uStack_d4;
        lStack_c8 = (long)iVar11 << 2;
        uVar13 = 0;
        lVar17 = extraout_RDX;
        uStack_d0 = uVar5;
        do {
          if (0 < (int)uStack_d4) {
            uVar15 = 0;
            do {
              bStack_d5 = (byte)(int)*(float *)(lVar17 + uVar15 * 4);
              fn = (char *)(ulong)uVar2;
              pbVar9 = &bStack_d5;
              sVar3 = write(uVar2,&bStack_d5,1);
              uVar1 = (uint)uVar5;
              if (sVar3 != 1) {
                pputrast_cold_3();
                goto LAB_00102fe1;
              }
              uVar15 = uVar15 + 1;
            } while (uVar6 != uVar15);
          }
          uVar13 = uVar13 + 1;
          lVar17 = lVar17 + lStack_c8;
        } while (uVar13 != uStack_d0);
      }
      close(uVar2);
      return;
    }
  }
  pputrast_cold_2();
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      iVar11 = *(int *)fn;
      iVar10 = extraout_EDX_00;
      uVar12 = uVar1;
      do {
        iVar7 = (int)pbVar9;
        *(ulong *)(*(long *)((long)fn + 0x158) + (long)(iVar11 * iVar7 + iVar10) * 8) =
             CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        iVar11 = *(int *)fn;
        *(ulong *)(*(long *)((long)fn + ((long)(*(int *)((long)fn + 0xc) / 2) * 2 + 0x2e) * 4) +
                   0x24 + (long)(iVar7 * iVar11 + iVar10) * 0x30) =
             CONCAT44((float)in_XMM2_Qa,(float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
        iVar10 = iVar10 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar2 = uVar2 + 1;
      pbVar9 = (byte *)(ulong)(iVar7 + 1);
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void pgetrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    if (read(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          if (read(fd,&c,sizeof(c)) != 1) {
            error(4) ;
          }
          bf[r*i + j] = (float)c ;
        }
      }
    }
    else {
      error(5) ;
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}